

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerBreakpointManager.cxx
# Opt level: O1

void __thiscall
cmDebugger::cmDebuggerBreakpointManager::cmDebuggerBreakpointManager
          (cmDebuggerBreakpointManager *this,Session *dapSession)

{
  TypeInfo *pTVar1;
  cmDebuggerBreakpointManager *local_48;
  undefined8 uStack_40;
  code *local_38;
  code *pcStack_30;
  
  this->DapSession = dapSession;
  (this->Mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->Mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->Mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->Mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->Mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->Breakpoints)._M_h._M_buckets = &(this->Breakpoints)._M_h._M_single_bucket;
  (this->Breakpoints)._M_h._M_bucket_count = 1;
  (this->Breakpoints)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->Breakpoints)._M_h._M_element_count = 0;
  (this->Breakpoints)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->Breakpoints)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->Breakpoints)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->ListFileFunctionLines)._M_h._M_buckets =
       &(this->ListFileFunctionLines)._M_h._M_single_bucket;
  (this->ListFileFunctionLines)._M_h._M_bucket_count = 1;
  (this->ListFileFunctionLines)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ListFileFunctionLines)._M_h._M_element_count = 0;
  (this->ListFileFunctionLines)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->ListFileFunctionLines)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ListFileFunctionLines)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->ListFilePendingValidations)._M_h._M_buckets =
       &(this->ListFilePendingValidations)._M_h._M_single_bucket;
  (this->ListFilePendingValidations)._M_h._M_bucket_count = 1;
  (this->ListFilePendingValidations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ListFilePendingValidations)._M_h._M_element_count = 0;
  (this->ListFilePendingValidations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this->NextBreakpointId = 0;
  (this->ListFilePendingValidations)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ListFilePendingValidations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pTVar1 = dap::TypeOf<dap::SetBreakpointsRequest>::type();
  uStack_40 = 0;
  pcStack_30 = std::
               _Function_handler<void_(const_void_*,_const_std::function<void_(const_dap::TypeInfo_*,_const_void_*)>_&,_const_std::function<void_(const_dap::TypeInfo_*,_const_dap::Error_&)>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:345:19)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(const_void_*,_const_std::function<void_(const_dap::TypeInfo_*,_const_void_*)>_&,_const_std::function<void_(const_dap::TypeInfo_*,_const_dap::Error_&)>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:345:19)>
             ::_M_manager;
  local_48 = this;
  (*dapSession->_vptr_Session[7])(dapSession,pTVar1);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  return;
}

Assistant:

cmDebuggerBreakpointManager::cmDebuggerBreakpointManager(
  dap::Session* dapSession)
  : DapSession(dapSession)
{
  // https://microsoft.github.io/debug-adapter-protocol/specification#Requests_SetBreakpoints
  DapSession->registerHandler([&](const dap::SetBreakpointsRequest& request) {
    return HandleSetBreakpointsRequest(request);
  });
}